

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O1

void __thiscall IR::IndirOpnd::SetIndexOpnd(IndirOpnd *this,RegOpnd *indexOpnd)

{
  undefined1 *puVar1;
  RegOpnd *pRVar2;
  Func *func;
  code *pcVar3;
  bool bVar4;
  byte bVar5;
  undefined4 *puVar6;
  
  pRVar2 = this->m_indexOpnd;
  if (pRVar2 != (RegOpnd *)0x0) {
    if (((pRVar2->super_Opnd).field_0xb & 2) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x2a,"(m_inUse)","Expected inUse to be set...");
      if (!bVar4) goto LAB_00620cf2;
      *puVar6 = 0;
    }
    puVar1 = &(pRVar2->super_Opnd).field_0xb;
    *puVar1 = *puVar1 & 0xfd;
  }
  if (indexOpnd == (RegOpnd *)0x0) {
    indexOpnd = (RegOpnd *)0x0;
  }
  else {
    func = this->m_func;
    if ((indexOpnd->super_Opnd).isDeleted == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x14,"(!isDeleted)","Using deleted operand");
      if (!bVar4) goto LAB_00620cf2;
      *puVar6 = 0;
    }
    bVar5 = (indexOpnd->super_Opnd).field_0xb;
    if ((bVar5 & 2) != 0) {
      indexOpnd = (RegOpnd *)Opnd::Copy(&indexOpnd->super_Opnd,func);
      bVar5 = (indexOpnd->super_Opnd).field_0xb;
    }
    (indexOpnd->super_Opnd).field_0xb = bVar5 | 2;
    if ((indexOpnd->super_Opnd).m_kind != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar4) {
LAB_00620cf2:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar6 = 0;
    }
  }
  this->m_indexOpnd = indexOpnd;
  return;
}

Assistant:

void
IndirOpnd::SetIndexOpnd(RegOpnd *indexOpnd)
{
    if (m_indexOpnd)
    {
        m_indexOpnd->UnUse();
    }
    if (indexOpnd)
    {
        indexOpnd = indexOpnd->Use(m_func)->AsRegOpnd();
    }

    m_indexOpnd = indexOpnd;
}